

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiID *pIVar1;
  ImGuiID *pIVar2;
  float fVar3;
  ImVec2 IVar4;
  ImGuiID IVar5;
  ImGuiWindow *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiContext *g;
  ImVec2 pos;
  ImVec2 local_18;
  
  pIVar7 = GImGui;
  pIVar6 = GImGui->MovingWindow;
  if (pIVar6 == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    IVar5 = GImGui->ActiveIdWindow->MoveId;
    if (IVar5 != GImGui->ActiveId) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar5;
    if (pIVar7->ActiveIdPreviousFrame == IVar5) {
      pIVar7->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar7->IO).MouseDown[0] != false) {
      return;
    }
    SetActiveID(0,(ImGuiWindow *)0x0);
    return;
  }
  pIVar1 = &GImGui->ActiveId;
  pIVar2 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = *pIVar1;
  if (*pIVar2 == *pIVar1) {
    pIVar7->ActiveIdPreviousFrameIsAlive = true;
  }
  pIVar6 = pIVar6->RootWindow;
  if (pIVar6 == (ImGuiWindow *)0x0) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                  ,0xc5c,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  if (((pIVar7->IO).MouseDown[0] != true) ||
     (bVar8 = IsMousePosValid(&(pIVar7->IO).MousePos), !bVar8)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar7->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  IVar4 = (pIVar7->IO).MousePos;
  local_18.x = IVar4.x - (pIVar7->ActiveIdClickOffset).x;
  local_18.y = IVar4.y - (pIVar7->ActiveIdClickOffset).y;
  fVar3 = (pIVar6->Pos).x;
  if ((fVar3 == local_18.x) && (!NAN(fVar3) && !NAN(local_18.x))) {
    fVar3 = (pIVar6->Pos).y;
    if ((fVar3 == local_18.y) && (!NAN(fVar3) && !NAN(local_18.y))) goto LAB_0010e9e1;
  }
  if (((pIVar6->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  SetWindowPos(pIVar6,&local_18,1);
LAB_0010e9e1:
  FocusWindow(pIVar7->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}